

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<unsigned_int,unsigned_int>
          (TestResult *result,uint expected,uint actual,char *file,uint line,char *expr)

{
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  TestResult *in_RDI;
  uint in_R8D;
  char *in_R9;
  char (*in_stack_00000178) [11];
  TestResult *in_stack_00000180;
  
  if (in_ESI != in_EDX) {
    TestResult::addFailure((TestResult *)CONCAT44(in_ESI,in_EDX),in_RCX,in_R8D,in_R9);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(uint *)in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(uint *)in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}